

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_acceptance.c
# Opt level: O0

REF_STATUS ref_acceptance_g(REF_NODE ref_node,char *function_name,REF_DBL *scalar)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  REF_DBL y;
  REF_DBL x;
  REF_INT node;
  REF_DBL *scalar_local;
  char *function_name_local;
  REF_NODE ref_node_local;
  
  x._4_4_ = 0;
  do {
    if (ref_node->max <= x._4_4_) {
      return 0;
    }
    if (((-1 < x._4_4_) && (x._4_4_ < ref_node->max)) && (-1 < ref_node->global[x._4_4_])) {
      dVar4 = ref_node->real[x._4_4_ * 0xf];
      dVar1 = ref_node->real[x._4_4_ * 0xf + 1];
      iVar2 = strcmp(function_name,"parabola");
      if (iVar2 != 0) {
        printf("%s: %d: %s %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
               ,0x196,"unknown user function",function_name);
        return 5;
      }
      dVar3 = cosh((-dVar1 * dVar1 + dVar4) * 50.0);
      dVar3 = pow(dVar3,2.0);
      scalar[x._4_4_ * 3] = 50.0 / dVar3;
      dVar4 = cosh((-dVar1 * dVar1 + dVar4) * 50.0);
      dVar4 = pow(dVar4,2.0);
      scalar[x._4_4_ * 3 + 1] = (dVar1 * -100.0) / dVar4;
      scalar[x._4_4_ * 3 + 2] = 0.0;
    }
    x._4_4_ = x._4_4_ + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_acceptance_g(REF_NODE ref_node,
                                           const char *function_name,
                                           REF_DBL *scalar) {
  REF_INT node;
  REF_DBL x, y;
  each_ref_node_valid_node(ref_node, node) {
    x = ref_node_xyz(ref_node, 0, node);
    y = ref_node_xyz(ref_node, 1, node);
    if (strcmp(function_name, "parabola") == 0) {
      /* tanh(50 * (x - y * y)) */
      scalar[0 + 3 * node] = 50.0 / pow(cosh(50 * (x - y * y)), 2);
      scalar[1 + 3 * node] = -100.0 * y / pow(cosh(50 * (x - y * y)), 2);
      scalar[2 + 3 * node] = 0.0;
    } else {
      printf("%s: %d: %s %s\n", __FILE__, __LINE__, "unknown user function",
             function_name);
      return REF_NOT_FOUND;
    }
  }
  return REF_SUCCESS;
}